

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void Ppmd7_EncodeSymbol(CPpmd7 *p,CPpmd7z_RangeEnc *rc,int symbol)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  Byte *pBVar6;
  uint j;
  int iVar7;
  ulong uVar8;
  CPpmd_See *pCVar9;
  uint uVar10;
  CPpmd7_Context *pCVar11;
  byte *pbVar12;
  UInt32 UVar13;
  int iVar14;
  UInt32 UVar15;
  uint uVar16;
  byte *pbVar17;
  UInt16 *pUVar18;
  UInt32 escFreq;
  size_t charMask [32];
  
  pCVar11 = p->MinContext;
  uVar5 = pCVar11->NumStats;
  if (uVar5 == 1) {
    bVar1 = *(byte *)((long)&pCVar11->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar11->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    bVar4 = (byte)pCVar11->SummFreq;
    pUVar18 = p->BinSumm[(ulong)bVar1 - 1] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 + (uint)p->HB2Flag[bVar4] * 2);
    uVar10 = (rc->Range >> 0xe) * (uint)*pUVar18;
    if ((uint)bVar4 == symbol) {
      rc->Range = uVar10;
      while (uVar10 < 0x1000000) {
        rc->Range = uVar10 << 8;
        RangeEnc_ShiftLow(rc);
        uVar10 = rc->Range;
      }
      *pUVar18 = (*pUVar18 - (short)(*pUVar18 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&pCVar11->SummFreq;
      Ppmd7_UpdateBin(p);
    }
    else {
      rc->Low = rc->Low + (ulong)uVar10;
      uVar10 = rc->Range - uVar10;
      rc->Range = uVar10;
      while (uVar10 < 0x1000000) {
        rc->Range = uVar10 << 8;
        RangeEnc_ShiftLow(rc);
        uVar10 = rc->Range;
      }
      uVar10 = (uint)*pUVar18 - (*pUVar18 + 0x20 >> 7);
      *pUVar18 = (ushort)uVar10;
      p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                         [(uVar10 & 0xffff) >> 10];
      for (uVar8 = 0; uVar8 < 0x20; uVar8 = uVar8 + 8) {
        charMask[uVar8] = 0xffffffffffffffff;
        charMask[uVar8 + 1] = 0xffffffffffffffff;
        charMask[uVar8 + 2] = 0xffffffffffffffff;
        charMask[uVar8 + 3] = 0xffffffffffffffff;
        charMask[uVar8 + 4] = 0xffffffffffffffff;
        charMask[uVar8 + 5] = 0xffffffffffffffff;
        charMask[uVar8 + 6] = 0xffffffffffffffff;
        charMask[uVar8 + 7] = 0xffffffffffffffff;
      }
      *(undefined1 *)((long)charMask + (ulong)(byte)pCVar11->SummFreq) = 0;
      p->PrevSuccess = 0;
    }
    if ((uint)bVar4 == symbol) {
      return;
    }
  }
  else {
    pBVar6 = p->Base;
    uVar8 = (ulong)pCVar11->Stats;
    if ((uint)pBVar6[uVar8] == symbol) {
      RangeEnc_Encode(rc,0,(uint)((CPpmd_State *)(pBVar6 + uVar8))->Freq,(uint)pCVar11->SummFreq);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar8);
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    pbVar12 = pBVar6 + (uVar8 - 6);
    UVar13 = (UInt32)pBVar6[uVar8 + 1];
    iVar7 = uVar5 - 1;
    iVar14 = iVar7;
    do {
      bVar1 = pbVar12[0xc];
      if ((uint)bVar1 == symbol) {
        RangeEnc_Encode(rc,UVar13,(uint)pbVar12[0xd],(uint)pCVar11->SummFreq);
        p->FoundState = (CPpmd_State *)(pbVar12 + 0xc);
        Ppmd7_Update1(p);
        return;
      }
      UVar13 = UVar13 + pbVar12[0xd];
      pbVar12 = pbVar12 + 6;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    for (uVar8 = 0; uVar8 < 0x20; uVar8 = uVar8 + 8) {
      charMask[uVar8] = 0xffffffffffffffff;
      charMask[uVar8 + 1] = 0xffffffffffffffff;
      charMask[uVar8 + 2] = 0xffffffffffffffff;
      charMask[uVar8 + 3] = 0xffffffffffffffff;
      charMask[uVar8 + 4] = 0xffffffffffffffff;
      charMask[uVar8 + 5] = 0xffffffffffffffff;
      charMask[uVar8 + 6] = 0xffffffffffffffff;
      charMask[uVar8 + 7] = 0xffffffffffffffff;
    }
    *(undefined1 *)((long)charMask + (ulong)bVar1) = 0;
    do {
      *(undefined1 *)((long)charMask + (ulong)*pbVar12) = 0;
      pbVar12 = pbVar12 + -6;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    RangeEnc_Encode(rc,UVar13,pCVar11->SummFreq - UVar13,(uint)pCVar11->SummFreq);
  }
  do {
    pCVar11 = p->MinContext;
    uVar5 = pCVar11->NumStats;
    uVar10 = p->OrderFall;
    do {
      uVar8 = (ulong)pCVar11->Suffix;
      if (uVar8 == 0) {
        p->OrderFall = uVar10 + 1;
        return;
      }
      pCVar11 = (CPpmd7_Context *)(p->Base + uVar8);
      p->MinContext = pCVar11;
      uVar10 = uVar10 + 1;
    } while (*(ushort *)(p->Base + uVar8) == uVar5);
    p->OrderFall = uVar10;
    pCVar9 = Ppmd7_MakeEscFreq(p,(uint)uVar5,&escFreq);
    uVar10 = (uint)p->MinContext->NumStats;
    pbVar12 = p->Base + (ulong)p->MinContext->Stats + 1;
    UVar13 = 0;
    do {
      bVar1 = pbVar12[-1];
      if ((uint)bVar1 == symbol) {
        uVar16 = 0;
        pbVar17 = pbVar12;
        UVar15 = UVar13;
        do {
          UVar15 = UVar15 + (*(byte *)((long)charMask + (ulong)pbVar17[-1]) & *pbVar17);
          pbVar17 = pbVar17 + 6;
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
        RangeEnc_Encode(rc,UVar13,(uint)*pbVar12,escFreq + UVar15);
        bVar1 = pCVar9->Shift;
        if (bVar1 < 7) {
          pBVar6 = &pCVar9->Count;
          *pBVar6 = *pBVar6 + 0xff;
          if (*pBVar6 == '\0') {
            pCVar9->Summ = pCVar9->Summ << 1;
            pCVar9->Shift = bVar1 + 1;
            pCVar9->Count = (Byte)(3 << (bVar1 & 0x1f));
          }
        }
        p->FoundState = (CPpmd_State *)(pbVar12 + -1);
        Ppmd7_Update2(p);
        return;
      }
      UVar13 = UVar13 + (*(byte *)((long)charMask + (ulong)bVar1) & *pbVar12);
      *(undefined1 *)((long)charMask + (ulong)bVar1) = 0;
      pbVar12 = pbVar12 + 6;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    UVar15 = escFreq + UVar13;
    RangeEnc_Encode(rc,UVar13,escFreq,UVar15);
    pCVar9->Summ = pCVar9->Summ + (short)UVar15;
  } while( true );
}

Assistant:

static void Ppmd7_EncodeSymbol(CPpmd7 *p, CPpmd7z_RangeEnc *rc, int symbol)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    UInt32 sum;
    unsigned i;
    if (s->Symbol == symbol)
    {
      RangeEnc_Encode(rc, 0, s->Freq, p->MinContext->SummFreq);
      p->FoundState = s;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    sum = s->Freq;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((++s)->Symbol == symbol)
      {
        RangeEnc_Encode(rc, sum, s->Freq, p->MinContext->SummFreq);
        p->FoundState = s;
        Ppmd7_Update1(p);
        return;
      }
      sum += s->Freq;
    }
    while (--i);
    
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
    RangeEnc_Encode(rc, sum, p->MinContext->SummFreq - sum, p->MinContext->SummFreq);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    CPpmd_State *s = Ppmd7Context_OneState(p->MinContext);
    if (s->Symbol == symbol)
    {
      RangeEnc_EncodeBit_0(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      p->FoundState = s;
      Ppmd7_UpdateBin(p);
      return;
    }
    else
    {
      RangeEnc_EncodeBit_1(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
      p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
      PPMD_SetAllBitsIn256Bytes(charMask);
      MASK(s->Symbol) = 0;
      p->PrevSuccess = 0;
    }
  }
  for (;;)
  {
    UInt32 escFreq;
    CPpmd_See *see;
    CPpmd_State *s;
    UInt32 sum;
    unsigned i, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return; /* EndMarker (symbol = -1) */
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &escFreq);
    s = Ppmd7_GetStats(p, p->MinContext);
    sum = 0;
    i = p->MinContext->NumStats;
    do
    {
      int cur = s->Symbol;
      if (cur == symbol)
      {
        UInt32 low = sum;
        CPpmd_State *s1 = s;
        do
        {
          sum += (s->Freq & (int)(MASK(s->Symbol)));
          s++;
        }
        while (--i);
        RangeEnc_Encode(rc, low, s1->Freq, sum + escFreq);
        Ppmd_See_Update(see);
        p->FoundState = s1;
        Ppmd7_Update2(p);
        return;
      }
      sum += (s->Freq & (int)(MASK(cur)));
      MASK(cur) = 0;
      s++;
    }
    while (--i);
    
    RangeEnc_Encode(rc, sum, escFreq, sum + escFreq);
    see->Summ = (UInt16)(see->Summ + sum + escFreq);
  }
}